

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

bool __thiscall VkSpecParser::parse(VkSpecParser *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  undefined1 auVar8 [16];
  
  QFile::setFileName((QString *)this);
  cVar1 = QFile::open(this,0x11);
  if (cVar1 == '\0') {
    parse(this);
  }
  else {
    QXmlStreamReader::setDevice((QIODevice *)&this->m_reader);
    QList<VkSpecParser::Command>::clear(&this->m_commands);
    QMap<QString,_QList<QString>_>::clear(&this->m_versionCommandMapping);
    cVar2 = QXmlStreamReader::atEnd();
    while (cVar2 == '\0') {
      QXmlStreamReader::readNext();
      iVar3 = QXmlStreamReader::tokenType();
      if (iVar3 == 4) {
        auVar8 = QXmlStreamReader::name();
        if ((auVar8._0_8_ == 8) &&
           (QVar4.m_data = auVar8._8_8_, QVar4.m_size = 8, QVar6.m_data = L"commands",
           QVar6.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar4,QVar6), cVar2 != '\0')) {
          parseCommands(this);
        }
        else {
          auVar8 = QXmlStreamReader::name();
          if ((auVar8._0_8_ == 7) &&
             (QVar5.m_data = auVar8._8_8_, QVar5.m_size = 7, QVar7.m_data = L"feature",
             QVar7.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar5,QVar7), cVar2 != '\0')) {
            parseFeature(this);
          }
        }
      }
      cVar2 = QXmlStreamReader::atEnd();
    }
  }
  return (bool)cVar1;
}

Assistant:

bool VkSpecParser::parse()
{
    m_file.setFileName(m_fn);
    if (!m_file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(m_file.fileName()));
        return false;
    }
    m_reader.setDevice(&m_file);

    m_commands.clear();
    m_versionCommandMapping.clear();

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("commands"))
                parseCommands();
            else if (m_reader.name() == QStringLiteral("feature"))
                parseFeature();
        }
    }

    return true;
}